

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall CSourceFilesProcessor::Error(CSourceFilesProcessor *this,CError *error)

{
  TErrorSeverity TVar1;
  string *psVar2;
  ostream *this_00;
  CError *error_local;
  CSourceFilesProcessor *this_local;
  
  psVar2 = Refal2::CError::UserMessage_abi_cxx11_(error);
  this_00 = std::operator<<((ostream *)&std::cerr,(string *)psVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TVar1 = Refal2::CError::Severity(error);
  if (TVar1 == ES_FatalError) {
    std::ios::clear((int)this + 0x1f98 + (int)*(undefined8 *)(*(long *)&this->file + -0x18));
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x19e320);
  }
  return;
}

Assistant:

void CSourceFilesProcessor::Error( const CError& error )
{
	std::cerr << error.UserMessage() << std::endl;
	if( error.Severity() == ES_FatalError ) {
		file.clear( std::ios_base::eofbit );
		std::cin.clear( std::ios_base::eofbit );
	}
}